

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Vec_Wec_t * Gia_ManFindCofs(Gia_Man_t *p,Vec_Int_t *vRes,Gia_Man_t **ppNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_02;
  bool bVar6;
  Vec_Int_t *vLayer;
  Gia_Man_t *pNew;
  int nMints;
  int m;
  int i;
  int Value;
  Vec_Wec_t *vCofs;
  Gia_Obj_t *pObj;
  Gia_Man_t **ppNew_local;
  Vec_Int_t *vRes_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vRes);
  p_00 = Vec_WecStart(1 << ((byte)iVar1 & 0x1f));
  iVar1 = Vec_IntSize(vRes);
  iVar2 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  iVar2 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_01,iVar2);
  Gia_ManHashAlloc(p_01);
  Gia_ManFillValue(p);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iVar2 = Vec_IntSize(vRes);
  iVar3 = Gia_ManCiNum(p);
  if (iVar3 <= iVar2) {
    __assert_fail("Vec_IntSize(vRes) < Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x40f,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
  }
  nMints = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (nMints < iVar2) {
      vCofs = (Vec_Wec_t *)Gia_ManCi(p,nMints);
      bVar6 = vCofs != (Vec_Wec_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ManAppendCi(p_01);
    *(int *)&vCofs->pArray = iVar2;
    nMints = nMints + 1;
  }
  pNew._4_4_ = 0;
  while( true ) {
    if (1 << ((byte)iVar1 & 0x1f) <= pNew._4_4_) {
      if (ppNew != (Gia_Man_t **)0x0) {
        *ppNew = p_01;
      }
      return p_00;
    }
    p_02 = Vec_WecEntry(p_00,pNew._4_4_);
    for (nMints = 0; iVar2 = Vec_IntSize(vRes), nMints < iVar2; nMints = nMints + 1) {
      iVar2 = Vec_IntEntry(vRes,nMints);
      pGVar5 = Gia_ManCi(p,iVar2);
      pGVar5->Value = pNew._4_4_ >> ((byte)nMints & 0x1f) & 1;
    }
    nMints = 0;
    while( true ) {
      bVar6 = false;
      if (nMints < p->nObjs) {
        vCofs = (Vec_Wec_t *)Gia_ManObj(p,nMints);
        bVar6 = vCofs != (Vec_Wec_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)vCofs);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFanin0Copy((Gia_Obj_t *)vCofs);
        iVar3 = Gia_ObjFanin1Copy((Gia_Obj_t *)vCofs);
        iVar2 = Gia_ManHashAnd(p_01,iVar2,iVar3);
        *(int *)&vCofs->pArray = iVar2;
      }
      nMints = nMints + 1;
    }
    nMints = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (nMints < iVar2) {
        vCofs = (Vec_Wec_t *)Gia_ManCo(p,nMints);
        bVar6 = vCofs != (Vec_Wec_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjFanin0Copy((Gia_Obj_t *)vCofs);
      Vec_IntPush(p_02,iVar2);
      nMints = nMints + 1;
    }
    iVar2 = Vec_IntSize(p_02);
    iVar3 = Gia_ManCoNum(p);
    if (iVar2 != iVar3) break;
    pNew._4_4_ = pNew._4_4_ + 1;
  }
  __assert_fail("Vec_IntSize(vLayer) == Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x41b,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
}

Assistant:

Vec_Wec_t * Gia_ManFindCofs( Gia_Man_t * p, Vec_Int_t * vRes, Gia_Man_t ** ppNew )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vCofs = Vec_WecStart( 1 << Vec_IntSize(vRes) );
    int Value, i, m, nMints = 1 << Vec_IntSize(vRes);
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    assert( Vec_IntSize(vRes) < Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( m = 0; m < nMints; m++ )
    {
        Vec_Int_t * vLayer = Vec_WecEntry( vCofs, m );
        Vec_IntForEachEntry( vRes, Value, i )
            Gia_ManCi(p, Value)->Value = (unsigned)((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            Vec_IntPush( vLayer, Gia_ObjFanin0Copy(pObj) );
        assert( Vec_IntSize(vLayer) == Gia_ManCoNum(p) );
        //printf( "%3d : ", m ); Vec_IntPrint( vLayer );
    }
    if ( ppNew != NULL )
        *ppNew = pNew;
    return vCofs;
}